

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msg_tracing_helpers.hpp
# Opt level: O2

void so_5::impl::msg_tracing_helpers::details::
     make_trace<so_5::abstract_message_chain_t_const&,so_5::impl::msg_tracing_helpers::details::composed_action_name,std::type_index_const&,so_5::intrusive_ptr_t<so_5::message_t>const&,so_5::impl::msg_tracing_helpers::details::chain_size>
               (tracer_t *tracer,abstract_message_chain_t *args,composed_action_name *args_1,
               type_index *args_2,intrusive_ptr_t<so_5::message_t> *args_3,chain_size *args_4)

{
  ostream *__out;
  id __id;
  basic_ostream<char,_std::char_traits<char>_> *pbVar1;
  ostringstream s;
  string local_1c8 [32];
  ostringstream local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  __out = std::operator<<((ostream *)local_1a8,"[tid=");
  __id._M_thread = pthread_self();
  pbVar1 = std::operator<<(__out,__id);
  std::operator<<(pbVar1,"]");
  make_trace_to<so_5::abstract_message_chain_t_const&,so_5::impl::msg_tracing_helpers::details::composed_action_name,std::type_index_const&,so_5::intrusive_ptr_t<so_5::message_t>const&,so_5::impl::msg_tracing_helpers::details::chain_size>
            ((ostream *)local_1a8,args,args_1,args_2,args_3,args_4);
  std::__cxx11::stringbuf::str();
  (*tracer->_vptr_tracer_t[2])(tracer,local_1c8);
  std::__cxx11::string::~string(local_1c8);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return;
}

Assistant:

void
make_trace(
	so_5::msg_tracing::tracer_t & tracer,
	ARGS &&... args ) SO_5_NOEXCEPT
	{
#if !defined( SO_5_HAVE_NOEXCEPT )
		so_5::details::invoke_noexcept_code( [&] {
#endif
				std::ostringstream s;

				s << "[tid=" << query_current_thread_id() << "]";

				make_trace_to( s, std::forward< ARGS >(args)... );

				tracer.trace( s.str() );
#if !defined( SO_5_HAVE_NOEXCEPT )
			} );
#endif
	}